

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O2

void __thiscall ccs::ast::BranchImpl::BranchImpl(BranchImpl *this,P *first,Traverse *traverse)

{
  (this->super_SelectorBranch)._vptr_SelectorBranch = (_func_int **)&PTR__BranchImpl_00173380;
  std::__shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->first_).super___shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2>,
             &first->super___shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2>);
  std::
  function<std::shared_ptr<ccs::BuildContext>_(ccs::ast::SelectorLeaf_&,_std::shared_ptr<ccs::BuildContext>,_std::shared_ptr<ccs::BuildContext>)>
  ::function(&this->traverse_,traverse);
  return;
}

Assistant:

BranchImpl(SelectorLeaf::P first, Traverse traverse) :
    first_(first), traverse_(traverse) {}